

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::lexer::token_type_name(string *__return_storage_ptr__,token_type t)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(t) {
  case uninitialized:
    pcVar2 = "<uninitialized>";
    paVar1 = &local_9;
    break;
  case literal_true:
    pcVar2 = "true literal";
    paVar1 = &local_a;
    break;
  case literal_false:
    pcVar2 = "false literal";
    paVar1 = &local_b;
    break;
  case literal_null:
    pcVar2 = "null literal";
    paVar1 = &local_c;
    break;
  case value_string:
    pcVar2 = "string literal";
    paVar1 = &local_d;
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    pcVar2 = "number literal";
    paVar1 = &local_e;
    break;
  case begin_array:
    pcVar2 = "\'[\'";
    paVar1 = &local_f;
    break;
  case begin_object:
    pcVar2 = "\'{\'";
    paVar1 = &local_10;
    break;
  case end_array:
    pcVar2 = "\']\'";
    paVar1 = &local_11;
    break;
  case end_object:
    pcVar2 = "\'}\'";
    paVar1 = &local_12;
    break;
  case name_separator:
    pcVar2 = "\':\'";
    paVar1 = &local_13;
    break;
  case value_separator:
    pcVar2 = "\',\'";
    paVar1 = &local_14;
    break;
  case parse_error:
    pcVar2 = "<parse error>";
    paVar1 = &local_15;
    break;
  case end_of_input:
    pcVar2 = "end of input";
    paVar1 = &local_16;
    break;
  default:
    pcVar2 = "unknown token";
    paVar1 = &local_17;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string token_type_name(const token_type t)
        {
            switch (t)
            {
                case token_type::uninitialized:
                    return "<uninitialized>";
                case token_type::literal_true:
                    return "true literal";
                case token_type::literal_false:
                    return "false literal";
                case token_type::literal_null:
                    return "null literal";
                case token_type::value_string:
                    return "string literal";
                case lexer::token_type::value_unsigned:
                case lexer::token_type::value_integer:
                case lexer::token_type::value_float:
                    return "number literal";
                case token_type::begin_array:
                    return "'['";
                case token_type::begin_object:
                    return "'{'";
                case token_type::end_array:
                    return "']'";
                case token_type::end_object:
                    return "'}'";
                case token_type::name_separator:
                    return "':'";
                case token_type::value_separator:
                    return "','";
                case token_type::parse_error:
                    return "<parse error>";
                case token_type::end_of_input:
                    return "end of input";
                default:
                {
                    // catch non-enum values
                    return "unknown token"; // LCOV_EXCL_LINE
                }
            }
        }